

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void askPassword(arguments *args)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  uint8_t *__dest;
  uint uVar6;
  bool bVar7;
  uint8_t pw1 [1024];
  uint8_t pw2 [1024];
  uint8_t local_838 [1024];
  uint8_t local_438 [1032];
  
  bVar7 = false;
  memset(local_838,0,0x400);
  memset(local_438,0,0x400);
  bVar1 = true;
  do {
    if (!bVar1) {
      puts("Passwords do not match");
    }
    sVar4 = getPassword("Enter password:",local_838,0x400,_stdin);
    uVar5 = getPassword("Confirm password:",local_438,0x400,_stdin);
    uVar6 = (uint)sVar4 & 0xffff;
    uVar2 = (uint)uVar5 & 0xffff;
    if (uVar2 < 6 || uVar6 < 6) {
      puts("Password must be at least 6 characters in length");
    }
    else {
      if (uVar6 == uVar2) {
        iVar3 = bcmp(local_838,local_438,uVar5 & 0xffff);
        if (iVar3 == 0) {
          bVar7 = true;
          goto LAB_0010a5e2;
        }
      }
      memset(local_838,0,0x400);
      memset(local_438,0,0x400);
    }
LAB_0010a5e2:
    bVar1 = false;
    if (bVar7) {
      puts("Password accepted");
      uVar5 = uVar5 & 0xffff;
      __dest = (uint8_t *)calloc(uVar5 + 1,1);
      args->password = __dest;
      memcpy(__dest,local_438,uVar5);
      args->field_0x3c = args->field_0x3c | 2;
      args->pw_length = uVar5;
      memset(local_838,0,0x400);
      memset(local_438,0,0x400);
      return;
    }
  } while( true );
}

Assistant:

void askPassword(arguments* args)
{
    bool first = true;
    bool match = false;
    const static uint8_t pw_prompt[] = 
    { 
        'E', 'n', 't', 'e', 'r', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd', ':', '\0'
    };
    const static uint8_t conf_prompt[] = 
    {
        'C', 'o', 'n', 'f', 'i', 'r', 'm', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd',
        ':', '\0'
    };

    uint8_t pw1[BUFF_SIZE] = { 0 };
    uint8_t pw2[BUFF_SIZE] = { 0 };
    uint16_t pw1_len = 0;
    uint16_t pw2_len = 0;
 
    while (match == false) //TODO find a portable way to do this
    {
        if (!first) { printf("Passwords do not match\n"); }

        first = false;

        pw1_len = getPassword((uint8_t*)pw_prompt, pw1, BUFF_SIZE, stdin);
        pw2_len = getPassword((uint8_t*)conf_prompt, pw2, BUFF_SIZE, stdin);

        if (pw1_len < 6 || pw2_len < 6) { printf("Password must be at least 6 characters in length\n"); } 
        else if ((pw1_len == pw2_len) && memcmp(pw1, pw2, pw2_len) == 0) { match = true; }
        else //clear buffers from failed pw attempts
        {
            zeroFill(pw1, BUFF_SIZE);
            zeroFill(pw2, BUFF_SIZE);
        }
    }

    printf("Password accepted\n");
    args->password = calloc(pw2_len+1, sizeof(uint8_t));
    memcpy(args->password, pw2, pw2_len);
    args->free = true; //set the flag to free it since we allocated memory for this pw
    args->pw_length = pw2_len; //ad the pw length to the arguments structure

    //zero_fill the temp pw_buffers
    zeroFill(pw1, BUFF_SIZE);
    zeroFill(pw2, BUFF_SIZE);
    pd3("password set to: %s\n", args->password);
}